

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

bool __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::DescriptorByNameEq::operator()
          (DescriptorByNameEq *this,DescriptorTable *lhs,string_view rhs)

{
  bool bVar1;
  int iVar2;
  DescriptorTable *pDVar3;
  
  pDVar3 = (DescriptorTable *)strlen((char *)this);
  if (pDVar3 == lhs) {
    if (lhs != (DescriptorTable *)0x0) {
      iVar2 = bcmp(this,(void *)rhs._M_len,(size_t)lhs);
      if (iVar2 != 0) goto LAB_0023fdb1;
    }
    bVar1 = true;
  }
  else {
LAB_0023fdb1:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(const google::protobuf::internal::DescriptorTable* lhs,
                    absl::string_view rhs) const {
      return (*this)(lhs->filename, rhs);
    }